

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.h
# Opt level: O3

void __thiscall jsonnet::internal::RuntimeError::~RuntimeError(RuntimeError *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->msg)._M_dataplus._M_p;
  paVar1 = &(this->msg).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::
  ~vector(&this->stackTrace);
  return;
}

Assistant:

RuntimeError(const std::vector<TraceFrame> stack_trace, const std::string &msg)
        : stackTrace(stack_trace), msg(msg)
    {
    }